

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_plats.cpp
# Opt level: O2

void __thiscall DPlat::PlayPlatSound(DPlat *this,char *sound)

{
  int iVar1;
  sector_t *sec;
  undefined4 in_EAX;
  undefined8 uStack_8;
  
  sec = (this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector;
  if ((sec->Flags & 0x40) == 0) {
    if (-1 < sec->seqType) {
      uStack_8 = 1;
      SN_StartSequence(sec,1,(int)sec->seqType,SEQ_PLATFORM,0,false);
      return;
    }
    iVar1 = (sec->SeqName).super_FName.Index;
    if (iVar1 == 0) {
      uStack_8 = 1;
      SN_StartSequence(sec,1,sound,0);
      return;
    }
    uStack_8 = CONCAT44(iVar1,in_EAX);
    SN_StartSequence(sec,1,(FName *)((long)&uStack_8 + 4),0);
  }
  return;
}

Assistant:

void DPlat::PlayPlatSound (const char *sound)
{
	if (m_Sector->Flags & SECF_SILENTMOVE) return;

	if (m_Sector->seqType >= 0)
	{
		SN_StartSequence (m_Sector, CHAN_FLOOR, m_Sector->seqType, SEQ_PLATFORM, 0);
	}
	else if (m_Sector->SeqName != NAME_None)
	{
		SN_StartSequence (m_Sector, CHAN_FLOOR, m_Sector->SeqName, 0);
	}
	else
	{
		SN_StartSequence (m_Sector, CHAN_FLOOR, sound, 0);
	}
}